

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void S_ClearSoundData(void)

{
  FMusicVolume *block;
  uint uVar1;
  sfxinfo_t *sfx;
  FMusicVolume *me;
  uint i;
  
  S_StopAllChannels();
  me._4_4_ = 0;
  while( true ) {
    uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx);
    if (uVar1 <= me._4_4_) break;
    sfx = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)me._4_4_);
    S_UnloadSound(sfx);
    me._4_4_ = me._4_4_ + 1;
  }
  TArray<sfxinfo_t,_sfxinfo_t>::Clear(&S_sfx);
  TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::Clear(&Ambients,1);
  while (block = MusicVolumes, MusicVolumes != (FMusicVolume *)0x0) {
    MusicVolumes = MusicVolumes->Next;
    M_Free(block);
  }
  TArray<FRandomSoundList,_FRandomSoundList>::Clear(&S_rnd);
  NumPlayerReserves = 0;
  PlayerClassesIsSorted = false;
  TArray<FPlayerClassLookup,_FPlayerClassLookup>::Clear(&PlayerClassLookups);
  TArray<FPlayerSoundHashTable,_FPlayerSoundHashTable>::Clear(&PlayerSounds);
  DefPlayerClass = 0;
  FString::operator=(&DefPlayerClassName,"");
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear(&MusicAliases,1);
  TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::Clear
            (&MidiDevices,1);
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::Clear(&HexenMusic,1);
  return;
}

Assistant:

static void S_ClearSoundData()
{
	unsigned int i;

	S_StopAllChannels();
	for (i = 0; i < S_sfx.Size(); ++i)
	{
		S_UnloadSound(&S_sfx[i]);
	}
	S_sfx.Clear();
	Ambients.Clear();
	while (MusicVolumes != NULL)
	{
		FMusicVolume *me = MusicVolumes;
		MusicVolumes = me->Next;
		M_Free(me);
	}
	S_rnd.Clear();

	NumPlayerReserves = 0;
	PlayerClassesIsSorted = false;
	PlayerClassLookups.Clear();
	PlayerSounds.Clear();
	DefPlayerClass = 0;
	DefPlayerClassName = "";
	MusicAliases.Clear();
	MidiDevices.Clear();
	HexenMusic.Clear();
}